

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O3

void __thiscall
randomx::AssemblyGeneratorX86::generateProgram(AssemblyGeneratorX86 *this,Program *prog)

{
  ostream *poVar1;
  Instruction *instr;
  uint i;
  long lVar2;
  
  this->registerUsage[4] = -1;
  this->registerUsage[5] = -1;
  this->registerUsage[6] = -1;
  this->registerUsage[7] = -1;
  this->registerUsage[0] = -1;
  this->registerUsage[1] = -1;
  this->registerUsage[2] = -1;
  this->registerUsage[3] = -1;
  std::__cxx11::stringbuf::str((string *)&this->field_0x18);
  instr = prog->programBuffer;
  lVar2 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->field_0x10,"randomx_isn_",0xc);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&this->field_0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    instr->src = instr->src & 7;
    instr->dst = instr->dst & 7;
    generateCode(this,instr,(int)lVar2);
    lVar2 = lVar2 + 1;
    instr = instr + 1;
  } while (lVar2 != 0x100);
  return;
}

Assistant:

void AssemblyGeneratorX86::generateProgram(Program& prog) {
		for (unsigned i = 0; i < RegistersCount; ++i) {
			registerUsage[i] = -1;
		}
		asmCode.str(std::string()); //clear
		for (unsigned i = 0; i < prog.getSize(); ++i) {
			asmCode << "randomx_isn_" << i << ":" << std::endl;
			Instruction& instr = prog(i);
			instr.src %= RegistersCount;
			instr.dst %= RegistersCount;
			generateCode(instr, i);
		}
	}